

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatrix33.h
# Opt level: O2

void __thiscall
chrono::ChMatrix33<double>::Set_A_quaternion(ChMatrix33<double> *this,ChQuaternion<double> *q)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  dVar1 = q->m_data[0];
  dVar2 = q->m_data[1];
  auVar12 = ZEXT816(0xbff0000000000000);
  auVar11 = ZEXT816(0x4000000000000000);
  dVar3 = q->m_data[2];
  dVar4 = q->m_data[3];
  dVar6 = dVar1 * dVar1;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar6 + dVar2 * dVar2;
  auVar8 = vfmadd213sd_fma(auVar10,auVar11,auVar12);
  (this->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       auVar8._0_8_;
  dVar7 = dVar2 * dVar3 - dVar1 * dVar4;
  dVar5 = dVar2 * dVar3 + dVar1 * dVar4;
  (this->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       dVar7 + dVar7;
  dVar7 = dVar1 * dVar3 + dVar2 * dVar4;
  (this->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       dVar7 + dVar7;
  (this->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       dVar5 + dVar5;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar6 + dVar3 * dVar3;
  auVar8 = vfmadd213sd_fma(auVar8,auVar11,auVar12);
  (this->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       auVar8._0_8_;
  dVar5 = dVar3 * dVar4 - dVar1 * dVar2;
  (this->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       dVar5 + dVar5;
  dVar5 = dVar2 * dVar4 - dVar1 * dVar3;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar6 + dVar4 * dVar4;
  auVar8 = vfmadd213sd_fma(auVar9,auVar11,auVar12);
  (this->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       dVar5 + dVar5;
  dVar1 = dVar1 * dVar2 + dVar3 * dVar4;
  (this->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       dVar1 + dVar1;
  (this->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       auVar8._0_8_;
  return;
}

Assistant:

inline void ChMatrix33<Real>::Set_A_quaternion(const ChQuaternion<Real>& q) {
    Real e0e0 = q.e0() * q.e0();
    Real e1e1 = q.e1() * q.e1();
    Real e2e2 = q.e2() * q.e2();
    Real e3e3 = q.e3() * q.e3();
    Real e0e1 = q.e0() * q.e1();
    Real e0e2 = q.e0() * q.e2();
    Real e0e3 = q.e0() * q.e3();
    Real e1e2 = q.e1() * q.e2();
    Real e1e3 = q.e1() * q.e3();
    Real e2e3 = q.e2() * q.e3();

    (*this)(0, 0) = (e0e0 + e1e1) * 2 - 1;
    (*this)(0, 1) = (e1e2 - e0e3) * 2;
    (*this)(0, 2) = (e1e3 + e0e2) * 2;
    (*this)(1, 0) = (e1e2 + e0e3) * 2;
    (*this)(1, 1) = (e0e0 + e2e2) * 2 - 1;
    (*this)(1, 2) = (e2e3 - e0e1) * 2;
    (*this)(2, 0) = (e1e3 - e0e2) * 2;
    (*this)(2, 1) = (e2e3 + e0e1) * 2;
    (*this)(2, 2) = (e0e0 + e3e3) * 2 - 1;
}